

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O3

astcenc_error
astcenc_config_init(astcenc_profile profile,uint block_x,uint block_y,uint block_z,float quality,
                   uint flags,astcenc_config *configp)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  ulong uVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar8;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  astcenc_error aVar19;
  uint uVar20;
  long lVar21;
  astcenc_preset_config *paVar22;
  array<astcenc_preset_config,_6UL> *paVar23;
  astcenc_preset_config *paVar24;
  long lVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [32];
  float fVar39;
  undefined1 auVar40 [16];
  float fVar43;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float xprec_testval;
  
  auVar29._0_12_ = ZEXT412(0);
  auVar29._12_4_ = 0;
  auVar38 = ZEXT1632(auVar29);
  configp->tune_mse_overshoot = (float)auVar38._0_4_;
  configp->tune_2partition_early_out_limit_factor = (float)auVar38._4_4_;
  configp->tune_3partition_early_out_limit_factor = (float)auVar38._8_4_;
  configp->tune_2plane_early_out_limit_correlation = (float)auVar38._12_4_;
  configp->tune_search_mode0_enable = (float)auVar38._16_4_;
  *(int *)&configp->field_0x6c = auVar38._20_4_;
  configp->progress_callback = (astcenc_progress_callback)auVar38._24_8_;
  configp->tune_refinement_limit = auVar38._0_4_;
  configp->tune_candidate_limit = auVar38._4_4_;
  configp->tune_2partitioning_candidate_limit = auVar38._8_4_;
  configp->tune_3partitioning_candidate_limit = auVar38._12_4_;
  configp->tune_4partitioning_candidate_limit = auVar38._16_4_;
  configp->tune_db_limit = (float)auVar38._20_4_;
  configp->tune_mse_overshoot = (float)auVar38._24_4_;
  configp->tune_2partition_early_out_limit_factor = (float)auVar38._28_4_;
  auVar38 = ZEXT1632(auVar29);
  configp->cw_a_weight = (float)auVar38._0_4_;
  configp->a_scale_radius = auVar38._4_4_;
  configp->rgbm_m_scale = (float)auVar38._8_4_;
  configp->tune_partition_count_limit = auVar38._12_4_;
  configp->tune_2partition_index_limit = auVar38._16_4_;
  configp->tune_3partition_index_limit = auVar38._20_4_;
  configp->tune_4partition_index_limit = auVar38._24_4_;
  configp->tune_block_mode_limit = auVar38._28_4_;
  configp->profile = auVar38._0_4_;
  configp->flags = auVar38._4_4_;
  configp->block_x = auVar38._8_4_;
  configp->block_y = auVar38._12_4_;
  configp->block_z = auVar38._16_4_;
  configp->cw_r_weight = (float)auVar38._20_4_;
  configp->cw_g_weight = (float)auVar38._24_4_;
  configp->cw_b_weight = (float)auVar38._28_4_;
  uVar26 = block_z + (block_z == 0);
  aVar19 = validate_block_size(block_x,block_y,uVar26);
  if (aVar19 == ASTCENC_SUCCESS) {
    configp->block_x = block_x;
    configp->block_y = block_y;
    configp->block_z = uVar26;
    uVar26 = block_y * block_x * uVar26;
    fVar27 = logf((float)uVar26);
    aVar19 = ASTCENC_ERR_BAD_QUALITY;
    if ((0.0 <= quality) && (quality <= 100.0)) {
      fVar27 = fVar27 / 2.3025851;
      paVar23 = &preset_configs_low;
      if (uVar26 < 0x40) {
        paVar23 = &preset_configs_mid;
      }
      paVar22 = preset_configs_high._M_elems;
      if (0x18 < (int)uVar26) {
        paVar22 = paVar23->_M_elems;
      }
      lVar21 = 0;
      auVar14._4_4_ = in_XMM0_Db;
      auVar14._0_4_ = quality;
      auVar14._8_4_ = in_XMM0_Dc;
      auVar14._12_4_ = in_XMM0_Dd;
      paVar24 = paVar22;
      do {
        if (quality <= ((astcenc_preset_config *)&paVar24->quality)->quality) goto LAB_0025cded;
        lVar21 = lVar21 + 1;
        paVar24 = paVar24 + 1;
      } while (lVar21 != 6);
      lVar21 = 6;
LAB_0025cded:
      lVar25 = 0;
      if (lVar21 != 0) {
        lVar25 = lVar21 + -1;
      }
      astcenc_config_init::preset_configs = (array<astcenc_preset_config,_6UL> *)paVar22;
      if (lVar25 == lVar21) {
        paVar24 = paVar22 + lVar21;
        puVar1 = &paVar24->tune_partition_count_limit;
        uVar26 = paVar24->tune_2partition_index_limit;
        uVar8 = *(undefined8 *)(puVar1 + 2);
        uVar17 = *(undefined8 *)(puVar1 + 4);
        uVar18 = *(undefined8 *)(puVar1 + 6);
        configp->tune_partition_count_limit = paVar24->tune_partition_count_limit;
        configp->tune_2partition_index_limit = uVar26;
        *(undefined8 *)&configp->tune_3partition_index_limit = uVar8;
        *(undefined8 *)&configp->tune_block_mode_limit = uVar17;
        *(undefined8 *)&configp->tune_candidate_limit = uVar18;
        uVar26 = paVar22[lVar21].tune_4partitioning_candidate_limit;
        configp->tune_3partitioning_candidate_limit =
             paVar22[lVar21].tune_3partitioning_candidate_limit;
        configp->tune_4partitioning_candidate_limit = uVar26;
        uVar2 = paVar22[lVar21].tune_db_limit_a_base;
        uVar9 = paVar22[lVar21].tune_db_limit_b_base;
        auVar30._0_4_ = (float)uVar2 + fVar27 * -35.0;
        auVar30._4_4_ = (float)uVar9 + fVar27 * -19.0;
        auVar30._8_4_ = fVar27 * 0.0 + 0.0;
        auVar30._12_4_ = fVar27 * 0.0 + 0.0;
        auVar29 = vmovshdup_avx(auVar30);
        auVar29 = vmaxss_avx(auVar30,auVar29);
        fVar28 = auVar29._0_4_;
        configp->tune_db_limit = fVar28;
        configp->tune_mse_overshoot = paVar22[lVar21].tune_mse_overshoot;
        uVar7._0_4_ = paVar22[lVar21].tune_2partition_early_out_limit_factor;
        uVar7._4_4_ = paVar22[lVar21].tune_3partition_early_out_limit_factor;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar7;
        configp->tune_2partition_early_out_limit_factor = (float)(undefined4)uVar7;
        configp->tune_3partition_early_out_limit_factor = (float)uVar7._4_4_;
        configp->tune_2plane_early_out_limit_correlation =
             paVar22[lVar21].tune_2plane_early_out_limit_correlation;
        fVar27 = paVar22[lVar21].tune_search_mode0_enable;
      }
      else {
        fVar28 = paVar22[lVar21].quality - paVar22[lVar25].quality;
        if (fVar28 <= 0.0) {
          __assert_fail("wt_range > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp"
                        ,0x21b,
                        "astcenc_error astcenc_config_init(astcenc_profile, unsigned int, unsigned int, unsigned int, float, unsigned int, astcenc_config *)"
                       );
        }
        auVar29 = vinsertps_avx(ZEXT416((uint)paVar22[lVar21].quality),auVar14,0x10);
        auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)paVar22[lVar25].quality),0x10);
        auVar29 = vsubps_avx(auVar29,auVar14);
        auVar32._4_4_ = fVar28;
        auVar32._0_4_ = fVar28;
        auVar32._8_4_ = fVar28;
        auVar32._12_4_ = fVar28;
        auVar32 = vdivps_avx(auVar29,auVar32);
        auVar29 = vpinsrd_avx(ZEXT416(paVar22[lVar21].tune_block_mode_limit),
                              paVar22[lVar25].tune_refinement_limit,1);
        auVar29 = vpinsrd_avx(auVar29,paVar22[lVar21].tune_candidate_limit,2);
        auVar29 = vpinsrd_avx(auVar29,paVar22[lVar25].tune_2partitioning_candidate_limit,3);
        auVar31 = vshufps_avx(auVar32,auVar32,0xe1);
        auVar14 = vpinsrd_avx(ZEXT416(paVar22[lVar21].tune_partition_count_limit),
                              paVar22[lVar25].tune_2partition_index_limit,1);
        auVar14 = vpinsrd_avx(auVar14,paVar22[lVar21].tune_3partition_index_limit,2);
        auVar14 = vpinsrd_avx(auVar14,paVar22[lVar25].tune_4partition_index_limit,3);
        auVar38._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar14;
        auVar38._16_16_ = ZEXT116(1) * auVar29;
        auVar42._8_4_ = 0x4b000000;
        auVar42._0_8_ = 0x4b0000004b000000;
        auVar42._12_4_ = 0x4b000000;
        auVar42._16_4_ = 0x4b000000;
        auVar42._20_4_ = 0x4b000000;
        auVar42._24_4_ = 0x4b000000;
        auVar42._28_4_ = 0x4b000000;
        auVar15 = vpblendw_avx2(auVar38,auVar42,0xaa);
        auVar38 = vpsrld_avx2(auVar38,0x10);
        auVar44._8_4_ = 0x53000000;
        auVar44._0_8_ = 0x5300000053000000;
        auVar44._12_4_ = 0x53000000;
        auVar44._16_4_ = 0x53000000;
        auVar44._20_4_ = 0x53000000;
        auVar44._24_4_ = 0x53000000;
        auVar44._28_4_ = 0x53000000;
        auVar38 = vpblendw_avx2(auVar38,auVar44,0xaa);
        auVar45._8_4_ = 0x53000080;
        auVar45._0_8_ = 0x5300008053000080;
        auVar45._12_4_ = 0x53000080;
        auVar45._16_4_ = 0x53000080;
        auVar45._20_4_ = 0x53000080;
        auVar45._24_4_ = 0x53000080;
        auVar45._28_4_ = 0x53000080;
        auVar38 = vsubps_avx(auVar38,auVar45);
        auVar29 = vpinsrd_avx(ZEXT416(paVar22[lVar25].tune_block_mode_limit),
                              paVar22[lVar21].tune_refinement_limit,1);
        auVar29 = vpinsrd_avx(auVar29,paVar22[lVar25].tune_candidate_limit,2);
        auVar29 = vpinsrd_avx(auVar29,paVar22[lVar21].tune_2partitioning_candidate_limit,3);
        fVar28 = auVar31._0_4_;
        fVar37 = auVar31._4_4_;
        auVar14 = vpinsrd_avx(ZEXT416(paVar22[lVar25].tune_partition_count_limit),
                              paVar22[lVar21].tune_2partition_index_limit,1);
        auVar14 = vpinsrd_avx(auVar14,paVar22[lVar25].tune_3partition_index_limit,2);
        auVar14 = vpinsrd_avx(auVar14,paVar22[lVar21].tune_4partition_index_limit,3);
        auVar33 = vmovshdup_avx(auVar32);
        auVar41._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar14;
        auVar41._16_16_ = ZEXT116(1) * auVar29;
        auVar16 = vpblendw_avx2(auVar41,auVar42,0xaa);
        auVar42 = vpsrld_avx2(auVar41,0x10);
        auVar42 = vpblendw_avx2(auVar42,auVar44,0xaa);
        auVar42 = vsubps_avx(auVar42,auVar45);
        fVar39 = auVar32._0_4_;
        fVar43 = auVar32._4_4_;
        configp->tune_partition_count_limit =
             (int)(fVar28 * (auVar15._0_4_ + auVar38._0_4_) +
                   fVar39 * (auVar16._0_4_ + auVar42._0_4_) + 0.5);
        configp->tune_2partition_index_limit =
             (int)(fVar37 * (auVar15._4_4_ + auVar38._4_4_) +
                   fVar43 * (auVar16._4_4_ + auVar42._4_4_) + 0.5);
        configp->tune_3partition_index_limit =
             (int)(fVar28 * (auVar15._8_4_ + auVar38._8_4_) +
                   fVar39 * (auVar16._8_4_ + auVar42._8_4_) + 0.5);
        configp->tune_4partition_index_limit =
             (int)(fVar37 * (auVar15._12_4_ + auVar38._12_4_) +
                   fVar43 * (auVar16._12_4_ + auVar42._12_4_) + 0.5);
        configp->tune_block_mode_limit =
             (int)(fVar28 * (auVar15._16_4_ + auVar38._16_4_) +
                   fVar39 * (auVar16._16_4_ + auVar42._16_4_) + 0.5);
        configp->tune_refinement_limit =
             (int)(fVar37 * (auVar15._20_4_ + auVar38._20_4_) +
                   fVar43 * (auVar16._20_4_ + auVar42._20_4_) + 0.5);
        configp->tune_candidate_limit =
             (int)(fVar28 * (auVar15._24_4_ + auVar38._24_4_) +
                   fVar39 * (auVar16._24_4_ + auVar42._24_4_) + 0.5);
        configp->tune_2partitioning_candidate_limit =
             (int)(fVar37 + auVar16._28_4_ + auVar42._28_4_ + 0.5);
        auVar29 = vunpcklpd_avx(ZEXT416(paVar22[lVar21].tune_3partitioning_candidate_limit),
                                ZEXT416(paVar22[lVar25].tune_4partitioning_candidate_limit));
        auVar40._8_8_ = 0x4330000000000000;
        auVar40._0_8_ = 0x4330000000000000;
        auVar29 = vorpd_avx(auVar29,auVar40);
        auVar29 = vsubpd_avx(auVar29,auVar40);
        auVar29 = vcvtpd2ps_avx(auVar29);
        auVar14 = vunpcklpd_avx(ZEXT416(paVar22[lVar25].tune_3partitioning_candidate_limit),
                                ZEXT416(paVar22[lVar21].tune_4partitioning_candidate_limit));
        auVar14 = vorpd_avx(auVar14,auVar40);
        auVar14 = vsubpd_avx(auVar14,auVar40);
        auVar14 = vcvtpd2ps_avx(auVar14);
        auVar36._0_4_ = (int)(fVar28 * auVar29._0_4_ + fVar39 * auVar14._0_4_ + 0.5);
        auVar36._4_4_ = (int)(fVar37 * auVar29._4_4_ + fVar43 * auVar14._4_4_ + 0.5);
        auVar36._8_4_ = (int)(auVar31._8_4_ * auVar29._8_4_ + auVar32._8_4_ * auVar14._8_4_ + 0.5);
        auVar36._12_4_ =
             (int)(auVar31._12_4_ * auVar29._12_4_ + auVar32._12_4_ * auVar14._12_4_ + 0.5);
        uVar8 = vmovlps_avx(auVar36);
        configp->tune_3partitioning_candidate_limit = (int)uVar8;
        configp->tune_4partitioning_candidate_limit = (int)((ulong)uVar8 >> 0x20);
        uVar3 = paVar22[lVar25].tune_db_limit_a_base;
        uVar10 = paVar22[lVar25].tune_db_limit_b_base;
        uVar4 = paVar22[lVar25].tune_2partition_early_out_limit_factor;
        uVar11 = paVar22[lVar25].tune_3partition_early_out_limit_factor;
        uVar5 = paVar22[lVar21].tune_db_limit_a_base;
        uVar12 = paVar22[lVar21].tune_db_limit_b_base;
        uVar6 = paVar22[lVar21].tune_2partition_early_out_limit_factor;
        uVar13 = paVar22[lVar21].tune_3partition_early_out_limit_factor;
        fVar37 = auVar33._0_4_;
        auVar31._0_4_ = fVar39 * (float)uVar3 + fVar37 * (float)uVar5 + fVar27 * -35.0;
        auVar31._4_4_ = fVar39 * (float)uVar10 + auVar33._4_4_ * (float)uVar12 + fVar27 * -19.0;
        auVar31._8_4_ = fVar39 * 0.0 + auVar33._8_4_ * 0.0 + fVar27 * 0.0;
        auVar31._12_4_ = fVar39 * 0.0 + auVar33._12_4_ * 0.0 + fVar27 * 0.0;
        auVar29 = vmovshdup_avx(auVar31);
        auVar29 = vmaxss_avx(auVar31,auVar29);
        fVar28 = auVar29._0_4_;
        configp->tune_db_limit = fVar28;
        configp->tune_mse_overshoot =
             fVar39 * paVar22[lVar25].tune_mse_overshoot +
             fVar37 * paVar22[lVar21].tune_mse_overshoot;
        auVar35._0_4_ = fVar39 * (float)uVar4 + fVar37 * (float)uVar6;
        auVar35._4_4_ = fVar39 * (float)uVar11 + auVar33._4_4_ * (float)uVar13;
        auVar35._8_4_ = fVar39 * 0.0 + auVar33._8_4_ * 0.0;
        auVar35._12_4_ = fVar39 * 0.0 + auVar33._12_4_ * 0.0;
        uVar8 = vmovlps_avx(auVar35);
        configp->tune_2partition_early_out_limit_factor = (float)(int)uVar8;
        configp->tune_3partition_early_out_limit_factor = (float)(int)((ulong)uVar8 >> 0x20);
        configp->tune_2plane_early_out_limit_correlation =
             fVar39 * paVar22[lVar25].tune_2plane_early_out_limit_correlation +
             fVar37 * paVar22[lVar21].tune_2plane_early_out_limit_correlation;
        auVar29 = vinsertps_avx(ZEXT416((uint)paVar22[lVar25].tune_search_mode0_enable),
                                ZEXT416((uint)paVar22[lVar21].tune_search_mode0_enable),0x10);
        auVar33._0_4_ = fVar39 * auVar29._0_4_;
        auVar33._4_4_ = fVar43 * auVar29._4_4_;
        auVar33._8_4_ = auVar32._8_4_ * auVar29._8_4_;
        auVar33._12_4_ = auVar32._12_4_ * auVar29._12_4_;
        auVar29 = vhaddps_avx(auVar33,auVar33);
        fVar27 = auVar29._0_4_;
      }
      configp->tune_search_mode0_enable = fVar27;
      configp->cw_r_weight = 1.0;
      configp->cw_g_weight = 1.0;
      configp->cw_b_weight = 1.0;
      configp->cw_a_weight = 1.0;
      configp->a_scale_radius = 0;
      configp->rgbm_m_scale = 0.0;
      configp->profile = profile;
      if (ASTCENC_PRF_LDR < profile) {
        if (1 < profile - ASTCENC_PRF_HDR_RGB_LDR_A) {
          return ASTCENC_ERR_BAD_PROFILE;
        }
        configp->tune_db_limit = 999.0;
        configp->tune_search_mode0_enable = 0.0;
        fVar28 = 999.0;
      }
      aVar19 = ASTCENC_ERR_BAD_FLAGS;
      if (((flags < 0x80) && ((flags & 0x41 & (flags & 0x41) - 1) == 0)) &&
         (aVar19 = ASTCENC_ERR_BAD_DECODE_MODE,
         ((profile & ~ASTCENC_PRF_LDR) == ASTCENC_PRF_HDR_RGB_LDR_A & (byte)((flags & 2) >> 1)) == 0
         )) {
        if ((flags & 1) == 0) {
          if (flags < 0x40) {
            if ((flags & 8) != 0) {
              configp->cw_r_weight = 0.675;
              configp->cw_g_weight = 1.3275;
              configp->cw_b_weight = 0.2475;
            }
          }
          else {
            configp->rgbm_m_scale = 5.0;
            configp->cw_a_weight = 10.0;
          }
        }
        else {
          uVar20 = configp->tune_partition_count_limit + 1;
          uVar26 = 4;
          if (uVar20 < 4) {
            uVar26 = uVar20;
          }
          configp->tune_partition_count_limit = uVar26;
          configp->cw_g_weight = 0.0;
          configp->cw_b_weight = 0.0;
          auVar34._0_4_ = auVar35._0_4_ * 1.5;
          auVar34._4_4_ = auVar35._4_4_ * 1.5;
          auVar34._8_4_ = auVar35._8_4_ * 1.5;
          auVar34._12_4_ = auVar35._12_4_ * 1.5;
          uVar8 = vmovlps_avx(auVar34);
          configp->tune_2partition_early_out_limit_factor = (float)(int)uVar8;
          configp->tune_3partition_early_out_limit_factor = (float)(int)((ulong)uVar8 >> 0x20);
          configp->tune_2plane_early_out_limit_correlation = 0.99;
          configp->tune_db_limit = fVar28 * 1.03;
        }
        configp->flags = flags;
        aVar19 = ASTCENC_SUCCESS;
      }
    }
  }
  return aVar19;
}

Assistant:

static astcenc_error validate_cpu_float()
{
	if32 p;
	volatile float xprec_testval = 2.51f;
	p.f = xprec_testval + 12582912.0f;
	float q = p.f - 12582912.0f;

	if (q != 3.0f)
	{
		return ASTCENC_ERR_BAD_CPU_FLOAT;
	}

	return ASTCENC_SUCCESS;
}